

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

_Bool cmdq_pop(cmd_context c)

{
  byte *pbVar1;
  uint32_t *puVar2;
  int iVar3;
  int iVar4;
  player_upkeep *ppVar5;
  code *pcVar6;
  player *ppVar7;
  wchar_t wVar8;
  _Bool _Var9;
  uint32_t uVar10;
  wchar_t wVar11;
  int iVar12;
  long lVar13;
  cmd_code cVar14;
  
  ppVar7 = player;
  if (repeating == '\x01') {
    wVar11 = ((cmd_tail + L'\x13') / 0x14) * -0x14 + cmd_tail + L'\x13';
    wVar8 = cmd_tail;
  }
  else {
    if (cmd_head == cmd_tail) {
      return false;
    }
    wVar11 = cmd_tail;
    wVar8 = L'\0';
    if (cmd_tail + L'\x01' != L'\x14') {
      wVar8 = cmd_tail + L'\x01';
    }
  }
  cmd_tail = wVar8;
  wVar8 = cmd_tail;
  iVar12 = cmd_queue[wVar11].background_command;
  if (iVar12 == 0) {
    last_command_idx = (cmd_tail + L'\x13') % 0x14;
  }
  cVar14 = CMD_COMMAND_MONSTER;
  if (player->timed[0x2c] == 0) {
    cVar14 = cmd_queue[wVar11].code;
  }
  iVar3 = cmd_queue[wVar11].nrepeats;
  lVar13 = 0x1c;
  while (*(cmd_code *)((long)mon_feeling_text + lVar13 + 0x34) != cVar14) {
    lVar13 = lVar13 + 0x20;
    if (lVar13 == 0xe9c) {
      player->upkeep->command_wrk = L'\0';
      return true;
    }
  }
  ppVar5 = player->upkeep;
  ppVar5->command_wrk = L'\0';
  if (*(char *)((long)mon_feeling_text + lVar13 + 0x4c) == '\x01') {
    iVar4 = *(int *)((long)&game_cmds[0].cmd + lVar13);
    if ((0 < iVar4) && (iVar3 == 0)) {
      cmd_queue[(wVar8 + L'\x13') % 0x14].nrepeats = iVar4;
      repeating = '\x01';
      pbVar1 = (byte *)((long)&ppVar5->redraw + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  else {
    cmd_queue[wVar11].nrepeats = 0;
    repeating = '\0';
  }
  repeat_prev_allowed = 1;
  cmd_queue[wVar11].context = c;
  pcVar6 = *(code **)((long)mon_feeling_text + lVar13 + 0x44);
  if (pcVar6 != (code *)0x0) {
    if (iVar12 < 2) {
      if ((*(char *)((long)mon_feeling_text + lVar13 + 0x4d) == '\x01') &&
         (ppVar7->skip_cmd_coercion == '\0')) {
        uVar10 = Rand_div(200);
        if ((int)uVar10 < (int)player->timed[0x31]) {
          _Var9 = player_attack_random_monster(player);
          if (_Var9) {
            return true;
          }
        }
        else if (player->timed[0x31] != 0) {
          player->skip_cmd_coercion = '\x01';
        }
      }
    }
    else if ((ppVar7->skip_cmd_coercion != '\0') &&
            (*(char *)((long)mon_feeling_text + lVar13 + 0x4d) == '\x01')) {
      ppVar7->skip_cmd_coercion = '\x02';
    }
    (*pcVar6)(cmd_queue + wVar11);
  }
  if (cmd_queue[wVar11].nrepeats < 1) {
    return true;
  }
  iVar12 = (cmd_tail + L'\x13') % 0x14;
  if (iVar3 != cmd_queue[iVar12].nrepeats) {
    return true;
  }
  repeating = iVar3 + -1 != 0;
  cmd_queue[iVar12].nrepeats = iVar3 + -1;
  puVar2 = &player->upkeep->redraw;
  *puVar2 = *puVar2 | 0x8000;
  return true;
}

Assistant:

bool cmdq_pop(cmd_context c)
{
	struct command *cmd;

	/* If we're repeating, just pull the last command again. */
	if (repeating) {
		cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];
	} else if (cmd_head != cmd_tail) {
		/* If we have a command ready, set it. */
		cmd = &cmd_queue[cmd_tail++];
		if (cmd_tail == CMD_QUEUE_SIZE)
			cmd_tail = 0;
	} else {
		/* Failure to get a command. */
		return false;
	}

	/* Now process it */
	if (!cmd->background_command) {
		last_command_idx = prev_cmd_idx(cmd_tail);
	}
	process_command(c, cmd);
	return true;
}